

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_B_cond_thumb(DisasContext_conflict1 *s,arg_ci *a)

{
  uint32_t uVar1;
  arg_ci *a_local;
  DisasContext_conflict1 *s_local;
  
  if (a->cond < 0xe) {
    if (s->condexec_mask == 0) {
      arm_skip_unless(s,a->cond);
      uVar1 = read_pc(s);
      gen_jmp(s,uVar1 + a->imm);
      s_local._7_1_ = true;
    }
    else {
      unallocated_encoding_aarch64(s);
      s_local._7_1_ = true;
    }
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_B_cond_thumb(DisasContext *s, arg_ci *a)
{
    /* This has cond from encoding, required to be outside IT block.  */
    if (a->cond >= 0xe) {
        return false;
    }
    if (s->condexec_mask) {
        unallocated_encoding(s);
        return true;
    }
    arm_skip_unless(s, a->cond);
    gen_jmp(s, read_pc(s) + a->imm);
    return true;
}